

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx::
     BVHNIntersector1<4,_16777232,_false,_embree::avx::ArrayIntersector1<embree::avx::QuadMiMBIntersector1Moeller<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar5;
  Ref<embree::Geometry> *pRVar6;
  Geometry *pGVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  AABBNodeMB4D *node1;
  ulong uVar100;
  long lVar101;
  uint uVar102;
  int iVar103;
  ulong uVar104;
  long lVar105;
  ulong uVar106;
  ulong uVar107;
  ulong uVar108;
  ulong uVar109;
  ulong uVar110;
  ulong uVar111;
  ulong uVar112;
  long lVar113;
  ulong uVar114;
  ulong uVar115;
  ulong uVar116;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  float fVar128;
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  float fVar129;
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  float fVar144;
  float fVar150;
  float fVar151;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar155;
  undefined1 auVar149 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [64];
  undefined1 auVar159 [32];
  undefined1 auVar160 [64];
  undefined1 auVar161 [32];
  undefined1 auVar162 [64];
  float fVar163;
  undefined1 auVar164 [16];
  undefined1 auVar165 [32];
  float fVar170;
  undefined1 auVar166 [32];
  float fVar168;
  float fVar169;
  float fVar171;
  float fVar172;
  float fVar173;
  undefined1 auVar167 [64];
  undefined1 auVar174 [32];
  uint uVar176;
  uint uVar177;
  uint uVar178;
  uint uVar179;
  uint uVar180;
  uint uVar181;
  uint uVar182;
  undefined1 auVar175 [64];
  undefined1 auVar183 [32];
  undefined1 auVar184 [64];
  undefined1 auVar185 [64];
  float fVar186;
  undefined1 auVar187 [16];
  float fVar192;
  undefined1 auVar188 [32];
  float fVar190;
  float fVar191;
  float fVar193;
  float fVar194;
  float fVar195;
  undefined1 auVar189 [64];
  undefined1 auVar196 [32];
  undefined1 auVar197 [64];
  undefined1 auVar198 [16];
  undefined1 auVar199 [32];
  undefined1 auVar200 [16];
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  NodeRef stack [244];
  int local_cd4;
  Scene *local_cd0;
  long local_cc8;
  undefined1 local_cc0 [8];
  float fStack_cb8;
  float fStack_cb4;
  undefined1 local_cb0 [8];
  float fStack_ca8;
  float fStack_ca4;
  ulong local_ca0;
  ulong local_c98;
  ulong *local_c90;
  long local_c88;
  ulong local_c80;
  ulong local_c78;
  long local_c70;
  ulong local_c68;
  ulong local_c60;
  ulong local_c58;
  ulong local_c50;
  ulong local_c48;
  undefined1 local_c40 [32];
  undefined1 local_c20 [32];
  float local_c00;
  float local_bfc;
  float local_bf8;
  float local_bf4;
  undefined4 local_bf0;
  undefined4 local_bec;
  uint local_be8;
  uint local_be4;
  uint local_be0;
  RTCFilterFunctionNArguments local_bd0;
  undefined1 local_ba0 [32];
  undefined1 local_b80 [32];
  undefined1 local_b60 [32];
  undefined1 local_b40 [16];
  undefined1 local_b30 [16];
  undefined1 local_b20 [16];
  undefined1 local_b10 [16];
  undefined1 local_b00 [16];
  undefined1 local_af0 [16];
  undefined1 local_ae0 [16];
  undefined1 local_ad0 [16];
  undefined1 local_ac0 [8];
  float fStack_ab8;
  float fStack_ab4;
  undefined1 local_ab0 [8];
  float fStack_aa8;
  float fStack_aa4;
  undefined1 local_aa0 [8];
  float fStack_a98;
  float fStack_a94;
  undefined1 local_a90 [8];
  float fStack_a88;
  float fStack_a84;
  undefined1 local_a80 [8];
  float fStack_a78;
  float fStack_a74;
  undefined1 local_a70 [8];
  float fStack_a68;
  float fStack_a64;
  undefined1 local_a60 [8];
  float fStack_a58;
  float fStack_a54;
  undefined1 local_a50 [8];
  float fStack_a48;
  float fStack_a44;
  undefined1 local_a40 [8];
  float fStack_a38;
  float fStack_a34;
  undefined1 local_a30 [16];
  undefined1 local_a20 [32];
  undefined1 local_a00 [8];
  float fStack_9f8;
  float fStack_9f4;
  float fStack_9f0;
  float fStack_9ec;
  float fStack_9e8;
  undefined1 local_9e0 [32];
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 uStack_9b0;
  undefined8 uStack_9a8;
  undefined8 local_9a0;
  undefined8 uStack_998;
  undefined8 uStack_990;
  undefined8 uStack_988;
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined1 local_8e0 [32];
  float local_8c0 [4];
  float fStack_8b0;
  float fStack_8ac;
  float fStack_8a8;
  undefined4 uStack_8a4;
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  float local_860 [4];
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  undefined4 uStack_844;
  float local_840 [4];
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  undefined4 uStack_824;
  float local_820 [4];
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  undefined4 uStack_804;
  ulong local_800;
  ulong local_7f8 [249];
  
  local_800 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_800 != 8) {
    fVar144 = ray->tfar;
    auVar158 = ZEXT1664(ZEXT816(0) << 0x40);
    if (0.0 <= fVar144) {
      local_c90 = local_7f8;
      auVar123 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      aVar5 = (ray->dir).field_0;
      auVar118._8_4_ = 0x7fffffff;
      auVar118._0_8_ = 0x7fffffff7fffffff;
      auVar118._12_4_ = 0x7fffffff;
      auVar118 = vandps_avx((undefined1  [16])aVar5,auVar118);
      auVar145._8_4_ = 0x219392ef;
      auVar145._0_8_ = 0x219392ef219392ef;
      auVar145._12_4_ = 0x219392ef;
      auVar118 = vcmpps_avx(auVar118,auVar145,1);
      auVar118 = vblendvps_avx((undefined1  [16])aVar5,auVar145,auVar118);
      auVar145 = vrcpps_avx(auVar118);
      fVar151 = auVar145._0_4_;
      auVar130._0_4_ = fVar151 * auVar118._0_4_;
      fVar152 = auVar145._4_4_;
      auVar130._4_4_ = fVar152 * auVar118._4_4_;
      fVar153 = auVar145._8_4_;
      auVar130._8_4_ = fVar153 * auVar118._8_4_;
      fVar154 = auVar145._12_4_;
      auVar130._12_4_ = fVar154 * auVar118._12_4_;
      auVar146._8_4_ = 0x3f800000;
      auVar146._0_8_ = 0x3f8000003f800000;
      auVar146._12_4_ = 0x3f800000;
      auVar118 = vsubps_avx(auVar146,auVar130);
      auVar131._0_4_ = fVar151 + fVar151 * auVar118._0_4_;
      auVar131._4_4_ = fVar152 + fVar152 * auVar118._4_4_;
      auVar131._8_4_ = fVar153 + fVar153 * auVar118._8_4_;
      auVar131._12_4_ = fVar154 + fVar154 * auVar118._12_4_;
      uVar3 = *(undefined4 *)&(ray->org).field_0;
      local_ad0._4_4_ = uVar3;
      local_ad0._0_4_ = uVar3;
      local_ad0._8_4_ = uVar3;
      local_ad0._12_4_ = uVar3;
      auVar160 = ZEXT1664(local_ad0);
      uVar3 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
      local_ae0._4_4_ = uVar3;
      local_ae0._0_4_ = uVar3;
      local_ae0._8_4_ = uVar3;
      local_ae0._12_4_ = uVar3;
      auVar162 = ZEXT1664(local_ae0);
      uVar3 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
      local_af0._4_4_ = uVar3;
      local_af0._0_4_ = uVar3;
      local_af0._8_4_ = uVar3;
      local_af0._12_4_ = uVar3;
      auVar167 = ZEXT1664(local_af0);
      local_b00 = vshufps_avx(auVar131,auVar131,0);
      auVar175 = ZEXT1664(local_b00);
      auVar118 = vmovshdup_avx(auVar131);
      local_b10 = vshufps_avx(auVar131,auVar131,0x55);
      auVar184 = ZEXT1664(local_b10);
      auVar145 = vshufpd_avx(auVar131,auVar131,1);
      uVar112 = (ulong)(auVar131._0_4_ < 0.0) << 4;
      local_b20 = vshufps_avx(auVar131,auVar131,0xaa);
      auVar185 = ZEXT1664(local_b20);
      uVar115 = (ulong)(auVar118._0_4_ < 0.0) << 4 | 0x20;
      uVar116 = (ulong)(auVar145._0_4_ < 0.0) << 4 | 0x40;
      local_b30 = vshufps_avx(auVar123,auVar123,0);
      auVar189 = ZEXT1664(local_b30);
      local_a20._16_16_ = mm_lookupmask_ps._240_16_;
      local_a20._0_16_ = mm_lookupmask_ps._240_16_;
      local_b40 = vshufps_avx(ZEXT416((uint)fVar144),ZEXT416((uint)fVar144),0);
      auVar197 = ZEXT1664(local_b40);
      local_9e0 = vperm2f128_avx(local_a20,mm_lookupmask_ps._0_32_,2);
      auVar120._8_4_ = 0xbf800000;
      auVar120._0_8_ = 0xbf800000bf800000;
      auVar120._12_4_ = 0xbf800000;
      auVar120._16_4_ = 0xbf800000;
      auVar120._20_4_ = 0xbf800000;
      auVar120._24_4_ = 0xbf800000;
      auVar120._28_4_ = 0xbf800000;
      auVar136._8_4_ = 0x3f800000;
      auVar136._0_8_ = 0x3f8000003f800000;
      auVar136._12_4_ = 0x3f800000;
      auVar136._16_4_ = 0x3f800000;
      auVar136._20_4_ = 0x3f800000;
      auVar136._24_4_ = 0x3f800000;
      auVar136._28_4_ = 0x3f800000;
      _local_a00 = vblendvps_avx(auVar136,auVar120,local_9e0);
      local_c98 = uVar112;
      local_ca0 = uVar115;
      uVar106 = uVar112;
      uVar108 = uVar115;
LAB_002c5eda:
      do {
        uVar107 = local_c90[-1];
        local_c90 = local_c90 + -1;
        while ((uVar107 & 8) == 0) {
          uVar100 = uVar107 & 0xfffffffffffffff0;
          fVar144 = (ray->dir).field_0.m128[3];
          auVar117._4_4_ = fVar144;
          auVar117._0_4_ = fVar144;
          auVar117._8_4_ = fVar144;
          auVar117._12_4_ = fVar144;
          pfVar2 = (float *)(uVar100 + 0x80 + uVar106);
          pfVar1 = (float *)(uVar100 + 0x20 + uVar106);
          auVar123._0_4_ = fVar144 * *pfVar2 + *pfVar1;
          auVar123._4_4_ = fVar144 * pfVar2[1] + pfVar1[1];
          auVar123._8_4_ = fVar144 * pfVar2[2] + pfVar1[2];
          auVar123._12_4_ = fVar144 * pfVar2[3] + pfVar1[3];
          auVar118 = vsubps_avx(auVar123,auVar160._0_16_);
          auVar122._0_4_ = auVar175._0_4_ * auVar118._0_4_;
          auVar122._4_4_ = auVar175._4_4_ * auVar118._4_4_;
          auVar122._8_4_ = auVar175._8_4_ * auVar118._8_4_;
          auVar122._12_4_ = auVar175._12_4_ * auVar118._12_4_;
          pfVar2 = (float *)(uVar100 + 0x80 + uVar108);
          auVar118 = vmaxps_avx(auVar189._0_16_,auVar122);
          pfVar1 = (float *)(uVar100 + 0x20 + uVar108);
          auVar132._0_4_ = fVar144 * *pfVar2 + *pfVar1;
          auVar132._4_4_ = fVar144 * pfVar2[1] + pfVar1[1];
          auVar132._8_4_ = fVar144 * pfVar2[2] + pfVar1[2];
          auVar132._12_4_ = fVar144 * pfVar2[3] + pfVar1[3];
          auVar123 = vsubps_avx(auVar132,auVar162._0_16_);
          pfVar2 = (float *)(uVar100 + 0x80 + uVar116);
          pfVar1 = (float *)(uVar100 + 0x20 + uVar116);
          auVar139._0_4_ = fVar144 * *pfVar2 + *pfVar1;
          auVar139._4_4_ = fVar144 * pfVar2[1] + pfVar1[1];
          auVar139._8_4_ = fVar144 * pfVar2[2] + pfVar1[2];
          auVar139._12_4_ = fVar144 * pfVar2[3] + pfVar1[3];
          auVar133._0_4_ = auVar184._0_4_ * auVar123._0_4_;
          auVar133._4_4_ = auVar184._4_4_ * auVar123._4_4_;
          auVar133._8_4_ = auVar184._8_4_ * auVar123._8_4_;
          auVar133._12_4_ = auVar184._12_4_ * auVar123._12_4_;
          auVar123 = vsubps_avx(auVar139,auVar167._0_16_);
          auVar140._0_4_ = auVar185._0_4_ * auVar123._0_4_;
          auVar140._4_4_ = auVar185._4_4_ * auVar123._4_4_;
          auVar140._8_4_ = auVar185._8_4_ * auVar123._8_4_;
          auVar140._12_4_ = auVar185._12_4_ * auVar123._12_4_;
          auVar123 = vmaxps_avx(auVar133,auVar140);
          pfVar2 = (float *)(uVar100 + 0x80 + (uVar112 ^ 0x10));
          pfVar1 = (float *)(uVar100 + 0x20 + (uVar112 ^ 0x10));
          auVar141._0_4_ = fVar144 * *pfVar2 + *pfVar1;
          auVar141._4_4_ = fVar144 * pfVar2[1] + pfVar1[1];
          auVar141._8_4_ = fVar144 * pfVar2[2] + pfVar1[2];
          auVar141._12_4_ = fVar144 * pfVar2[3] + pfVar1[3];
          auVar118 = vmaxps_avx(auVar118,auVar123);
          auVar123 = vsubps_avx(auVar141,auVar160._0_16_);
          auVar134._0_4_ = auVar175._0_4_ * auVar123._0_4_;
          auVar134._4_4_ = auVar175._4_4_ * auVar123._4_4_;
          auVar134._8_4_ = auVar175._8_4_ * auVar123._8_4_;
          auVar134._12_4_ = auVar175._12_4_ * auVar123._12_4_;
          auVar123 = vminps_avx(auVar197._0_16_,auVar134);
          pfVar2 = (float *)(uVar100 + 0x80 + (uVar115 ^ 0x10));
          pfVar1 = (float *)(uVar100 + 0x20 + (uVar115 ^ 0x10));
          auVar142._0_4_ = fVar144 * *pfVar2 + *pfVar1;
          auVar142._4_4_ = fVar144 * pfVar2[1] + pfVar1[1];
          auVar142._8_4_ = fVar144 * pfVar2[2] + pfVar1[2];
          auVar142._12_4_ = fVar144 * pfVar2[3] + pfVar1[3];
          auVar145 = vsubps_avx(auVar142,auVar162._0_16_);
          auVar143._0_4_ = auVar184._0_4_ * auVar145._0_4_;
          auVar143._4_4_ = auVar184._4_4_ * auVar145._4_4_;
          auVar143._8_4_ = auVar184._8_4_ * auVar145._8_4_;
          auVar143._12_4_ = auVar184._12_4_ * auVar145._12_4_;
          pfVar2 = (float *)(uVar100 + 0x80 + (uVar116 ^ 0x10));
          pfVar1 = (float *)(uVar100 + 0x20 + (uVar116 ^ 0x10));
          auVar147._0_4_ = fVar144 * *pfVar2 + *pfVar1;
          auVar147._4_4_ = fVar144 * pfVar2[1] + pfVar1[1];
          auVar147._8_4_ = fVar144 * pfVar2[2] + pfVar1[2];
          auVar147._12_4_ = fVar144 * pfVar2[3] + pfVar1[3];
          auVar145 = vsubps_avx(auVar147,auVar167._0_16_);
          auVar148._0_4_ = auVar185._0_4_ * auVar145._0_4_;
          auVar148._4_4_ = auVar185._4_4_ * auVar145._4_4_;
          auVar148._8_4_ = auVar185._8_4_ * auVar145._8_4_;
          auVar148._12_4_ = auVar185._12_4_ * auVar145._12_4_;
          auVar145 = vminps_avx(auVar143,auVar148);
          auVar123 = vminps_avx(auVar123,auVar145);
          if (((uint)uVar107 & 7) == 6) {
            auVar123 = vcmpps_avx(auVar118,auVar123,2);
            auVar118 = vcmpps_avx(*(undefined1 (*) [16])(uVar100 + 0xe0),auVar117,2);
            auVar145 = vcmpps_avx(auVar117,*(undefined1 (*) [16])(uVar100 + 0xf0),1);
            auVar118 = vandps_avx(auVar118,auVar145);
            auVar118 = vandps_avx(auVar118,auVar123);
          }
          else {
            auVar118 = vcmpps_avx(auVar118,auVar123,2);
          }
          auVar118 = vpslld_avx(auVar118,0x1f);
          uVar102 = vmovmskps_avx(auVar118);
          if (uVar102 == 0) {
            if (local_c90 == &local_800) {
              return;
            }
            goto LAB_002c5eda;
          }
          uVar102 = uVar102 & 0xff;
          lVar10 = 0;
          if (uVar102 != 0) {
            for (; (uVar102 >> lVar10 & 1) == 0; lVar10 = lVar10 + 1) {
            }
          }
          uVar107 = *(ulong *)(uVar100 + lVar10 * 8);
          uVar102 = uVar102 - 1 & uVar102;
          if (uVar102 != 0) {
            *local_c90 = uVar107;
            local_c90 = local_c90 + 1;
            lVar10 = 0;
            if (uVar102 != 0) {
              for (; (uVar102 >> lVar10 & 1) == 0; lVar10 = lVar10 + 1) {
              }
            }
            uVar107 = *(ulong *)(uVar100 + lVar10 * 8);
            uVar102 = uVar102 - 1 & uVar102;
            uVar104 = (ulong)uVar102;
            if (uVar102 != 0) {
              do {
                *local_c90 = uVar107;
                local_c90 = local_c90 + 1;
                lVar10 = 0;
                if (uVar104 != 0) {
                  for (; (uVar104 >> lVar10 & 1) == 0; lVar10 = lVar10 + 1) {
                  }
                }
                uVar107 = *(ulong *)(uVar100 + lVar10 * 8);
                uVar104 = uVar104 & uVar104 - 1;
              } while (uVar104 != 0);
            }
          }
        }
        local_c88 = (ulong)((uint)uVar107 & 0xf) - 8;
        if (local_c88 != 0) {
          uVar107 = uVar107 & 0xfffffffffffffff0;
          local_cd0 = context->scene;
          local_cc8 = 0;
          do {
            lVar101 = local_cc8 * 0x60;
            pRVar6 = (local_cd0->geometries).items;
            pGVar7 = pRVar6[*(uint *)(uVar107 + 0x40 + lVar101)].ptr;
            fVar144 = (pGVar7->time_range).lower;
            fVar144 = pGVar7->fnumTimeSegments *
                      (((ray->dir).field_0.m128[3] - fVar144) /
                      ((pGVar7->time_range).upper - fVar144));
            auVar118 = vroundss_avx(ZEXT416((uint)fVar144),ZEXT416((uint)fVar144),9);
            auVar118 = vminss_avx(auVar118,ZEXT416((uint)(pGVar7->fnumTimeSegments + -1.0)));
            auVar140 = vmaxss_avx(auVar158._0_16_,auVar118);
            iVar103 = (int)auVar140._0_4_;
            lVar113 = (long)iVar103 * 0x38;
            lVar10 = *(long *)(*(long *)&pGVar7[2].numPrimitives + lVar113);
            local_c58 = (ulong)*(uint *)(uVar107 + 4 + lVar101);
            auVar118 = *(undefined1 (*) [16])(lVar10 + (ulong)*(uint *)(uVar107 + lVar101) * 4);
            uVar108 = (ulong)*(uint *)(uVar107 + 0x10 + lVar101);
            auVar123 = *(undefined1 (*) [16])(lVar10 + uVar108 * 4);
            uVar100 = (ulong)*(uint *)(uVar107 + 0x20 + lVar101);
            auVar145 = *(undefined1 (*) [16])(lVar10 + uVar100 * 4);
            uVar104 = (ulong)*(uint *)(uVar107 + 0x30 + lVar101);
            auVar130 = *(undefined1 (*) [16])(lVar10 + uVar104 * 4);
            local_c70 = *(long *)&pRVar6[*(uint *)(uVar107 + 0x44 + lVar101)].ptr[2].numPrimitives;
            lVar10 = *(long *)(local_c70 + lVar113);
            auVar131 = *(undefined1 (*) [16])(lVar10 + local_c58 * 4);
            local_c48 = (ulong)*(uint *)(uVar107 + 0x14 + lVar101);
            auVar146 = *(undefined1 (*) [16])(lVar10 + local_c48 * 4);
            uVar109 = (ulong)*(uint *)(uVar107 + 0x24 + lVar101);
            auVar117 = *(undefined1 (*) [16])(lVar10 + uVar109 * 4);
            uVar110 = (ulong)*(uint *)(uVar107 + 0x34 + lVar101);
            auVar122 = *(undefined1 (*) [16])(lVar10 + uVar110 * 4);
            lVar10 = *(long *)&pRVar6[*(uint *)(uVar107 + 0x48 + lVar101)].ptr[2].numPrimitives;
            lVar8 = *(long *)(lVar10 + lVar113);
            uVar111 = (ulong)*(uint *)(uVar107 + 8 + lVar101);
            auVar132 = *(undefined1 (*) [16])(lVar8 + uVar111 * 4);
            local_c68 = (ulong)*(uint *)(uVar107 + 0x18 + lVar101);
            auVar133 = *(undefined1 (*) [16])(lVar8 + local_c68 * 4);
            local_c60 = (ulong)*(uint *)(uVar107 + 0x28 + lVar101);
            auVar134 = *(undefined1 (*) [16])(lVar8 + local_c60 * 4);
            local_c50 = (ulong)*(uint *)(uVar107 + 0x38 + lVar101);
            auVar139 = *(undefined1 (*) [16])(lVar8 + local_c50 * 4);
            fVar144 = fVar144 - auVar140._0_4_;
            local_a30 = ZEXT416((uint)fVar144);
            lVar8 = *(long *)&pRVar6[*(uint *)(uVar107 + 0x4c + lVar101)].ptr[2].numPrimitives;
            lVar113 = *(long *)(lVar8 + lVar113);
            uVar106 = (ulong)*(uint *)(uVar107 + 0xc + lVar101);
            auVar140 = *(undefined1 (*) [16])(lVar113 + uVar106 * 4);
            local_c80 = (ulong)*(uint *)(uVar107 + 0x1c + lVar101);
            auVar141 = *(undefined1 (*) [16])(lVar113 + local_c80 * 4);
            auVar142 = vunpcklps_avx(auVar118,auVar132);
            auVar132 = vunpckhps_avx(auVar118,auVar132);
            auVar143 = vunpcklps_avx(auVar131,auVar140);
            auVar131 = vunpckhps_avx(auVar131,auVar140);
            uVar114 = (ulong)*(uint *)(uVar107 + 0x2c + lVar101);
            auVar118 = *(undefined1 (*) [16])(lVar113 + uVar114 * 4);
            _local_a50 = vunpcklps_avx(auVar132,auVar131);
            auVar98 = _local_a50;
            _local_a90 = vunpcklps_avx(auVar142,auVar143);
            auVar94 = _local_a90;
            _local_a70 = vunpckhps_avx(auVar142,auVar143);
            auVar96 = _local_a70;
            auVar132 = vunpcklps_avx(auVar123,auVar133);
            auVar131 = vunpckhps_avx(auVar123,auVar133);
            auVar133 = vunpcklps_avx(auVar146,auVar141);
            auVar146 = vunpckhps_avx(auVar146,auVar141);
            local_c78 = (ulong)*(uint *)(uVar107 + 0x3c + lVar101);
            auVar123 = *(undefined1 (*) [16])(lVar113 + local_c78 * 4);
            _local_a40 = vunpcklps_avx(auVar131,auVar146);
            auVar99 = _local_a40;
            _local_a80 = vunpcklps_avx(auVar132,auVar133);
            auVar95 = _local_a80;
            _local_a60 = vunpckhps_avx(auVar132,auVar133);
            auVar97 = _local_a60;
            auVar146 = vunpcklps_avx(auVar145,auVar134);
            auVar145 = vunpckhps_avx(auVar145,auVar134);
            auVar132 = vunpcklps_avx(auVar117,auVar118);
            auVar131 = vunpckhps_avx(auVar117,auVar118);
            lVar105 = (long)(iVar103 + 1) * 0x38;
            lVar113 = *(long *)(*(long *)&pGVar7[2].numPrimitives + lVar105);
            auVar118 = *(undefined1 (*) [16])(lVar113 + (ulong)*(uint *)(uVar107 + lVar101) * 4);
            _local_cb0 = vunpcklps_avx(auVar145,auVar131);
            auVar90 = _local_cb0;
            _local_ac0 = vunpcklps_avx(auVar146,auVar132);
            auVar91 = _local_ac0;
            _local_aa0 = vunpckhps_avx(auVar146,auVar132);
            auVar93 = _local_aa0;
            auVar131 = vunpcklps_avx(auVar130,auVar139);
            auVar145 = vunpckhps_avx(auVar130,auVar139);
            auVar146 = vunpcklps_avx(auVar122,auVar123);
            auVar130 = vunpckhps_avx(auVar122,auVar123);
            lVar10 = *(long *)(lVar10 + lVar105);
            auVar123 = *(undefined1 (*) [16])(lVar10 + uVar111 * 4);
            _local_cc0 = vunpcklps_avx(auVar145,auVar130);
            auVar148 = _local_cc0;
            auVar117 = vunpcklps_avx(auVar131,auVar146);
            _local_ab0 = vunpckhps_avx(auVar131,auVar146);
            auVar92 = _local_ab0;
            lVar9 = *(long *)(local_c70 + lVar105);
            auVar130 = vunpcklps_avx(auVar118,auVar123);
            auVar145 = vunpckhps_avx(auVar118,auVar123);
            auVar118 = *(undefined1 (*) [16])(lVar9 + local_c58 * 4);
            lVar8 = *(long *)(lVar8 + lVar105);
            auVar123 = *(undefined1 (*) [16])(lVar8 + uVar106 * 4);
            auVar131 = vunpcklps_avx(auVar118,auVar123);
            auVar118 = vunpckhps_avx(auVar118,auVar123);
            auVar122 = vunpcklps_avx(auVar145,auVar118);
            auVar132 = vunpcklps_avx(auVar130,auVar131);
            auVar145 = vunpckhps_avx(auVar130,auVar131);
            auVar118 = *(undefined1 (*) [16])(lVar113 + uVar108 * 4);
            auVar123 = *(undefined1 (*) [16])(lVar10 + local_c68 * 4);
            auVar131 = vunpcklps_avx(auVar118,auVar123);
            auVar130 = vunpckhps_avx(auVar118,auVar123);
            auVar118 = *(undefined1 (*) [16])(lVar9 + local_c48 * 4);
            auVar123 = *(undefined1 (*) [16])(lVar8 + local_c80 * 4);
            auVar146 = vunpcklps_avx(auVar118,auVar123);
            auVar118 = vunpckhps_avx(auVar118,auVar123);
            auVar133 = vunpcklps_avx(auVar130,auVar118);
            auVar134 = vunpcklps_avx(auVar131,auVar146);
            auVar130 = vunpckhps_avx(auVar131,auVar146);
            auVar118 = *(undefined1 (*) [16])(lVar113 + uVar100 * 4);
            auVar123 = *(undefined1 (*) [16])(lVar10 + local_c60 * 4);
            auVar146 = vunpcklps_avx(auVar118,auVar123);
            auVar131 = vunpckhps_avx(auVar118,auVar123);
            auVar118 = *(undefined1 (*) [16])(lVar9 + uVar109 * 4);
            auVar123 = *(undefined1 (*) [16])(lVar8 + uVar114 * 4);
            auVar139 = vunpcklps_avx(auVar118,auVar123);
            auVar118 = vunpckhps_avx(auVar118,auVar123);
            auVar140 = vunpcklps_avx(auVar131,auVar118);
            auVar141 = vunpcklps_avx(auVar146,auVar139);
            auVar131 = vunpckhps_avx(auVar146,auVar139);
            auVar118 = *(undefined1 (*) [16])(lVar113 + uVar104 * 4);
            auVar123 = *(undefined1 (*) [16])(lVar10 + local_c50 * 4);
            auVar139 = vunpcklps_avx(auVar118,auVar123);
            auVar146 = vunpckhps_avx(auVar118,auVar123);
            auVar118 = *(undefined1 (*) [16])(lVar9 + uVar110 * 4);
            auVar123 = *(undefined1 (*) [16])(lVar8 + local_c78 * 4);
            auVar142 = vunpcklps_avx(auVar118,auVar123);
            auVar118 = vunpckhps_avx(auVar118,auVar123);
            auVar143 = vunpcklps_avx(auVar146,auVar118);
            auVar147 = vunpcklps_avx(auVar139,auVar142);
            auVar146 = vunpckhps_avx(auVar139,auVar142);
            auVar118 = vshufps_avx(local_a30,local_a30,0);
            auVar123 = ZEXT416((uint)(1.0 - fVar144));
            auVar123 = vshufps_avx(auVar123,auVar123,0);
            fVar144 = auVar118._0_4_;
            fVar151 = auVar118._4_4_;
            fVar152 = auVar118._8_4_;
            fVar153 = auVar118._12_4_;
            fVar154 = auVar123._0_4_;
            fVar155 = auVar123._4_4_;
            fVar128 = auVar123._8_4_;
            fVar129 = auVar123._12_4_;
            auVar149._4_4_ = fVar155 * (float)local_a90._4_4_ + auVar132._4_4_ * fVar151;
            auVar149._0_4_ = fVar154 * (float)local_a90._0_4_ + auVar132._0_4_ * fVar144;
            auVar149._8_4_ = fVar128 * fStack_a88 + auVar132._8_4_ * fVar152;
            auVar149._12_4_ = fVar129 * fStack_a84 + auVar132._12_4_ * fVar153;
            auVar156._4_4_ = fVar155 * (float)local_a70._4_4_ + auVar145._4_4_ * fVar151;
            auVar156._0_4_ = fVar154 * (float)local_a70._0_4_ + auVar145._0_4_ * fVar144;
            auVar156._8_4_ = fVar128 * fStack_a68 + auVar145._8_4_ * fVar152;
            auVar156._12_4_ = fVar129 * fStack_a64 + auVar145._12_4_ * fVar153;
            auVar161._4_4_ = fVar155 * (float)local_a50._4_4_ + auVar122._4_4_ * fVar151;
            auVar161._0_4_ = fVar154 * (float)local_a50._0_4_ + auVar122._0_4_ * fVar144;
            auVar161._8_4_ = fVar128 * fStack_a48 + auVar122._8_4_ * fVar152;
            auVar161._12_4_ = fVar129 * fStack_a44 + auVar122._12_4_ * fVar153;
            auVar164._0_4_ = fVar154 * (float)local_a80._0_4_ + fVar144 * auVar134._0_4_;
            auVar164._4_4_ = fVar155 * (float)local_a80._4_4_ + fVar151 * auVar134._4_4_;
            auVar164._8_4_ = fVar128 * fStack_a78 + fVar152 * auVar134._8_4_;
            auVar164._12_4_ = fVar129 * fStack_a74 + fVar153 * auVar134._12_4_;
            auVar135._0_4_ = fVar154 * (float)local_a60._0_4_ + fVar144 * auVar130._0_4_;
            auVar135._4_4_ = fVar155 * (float)local_a60._4_4_ + fVar151 * auVar130._4_4_;
            auVar135._8_4_ = fVar128 * fStack_a58 + fVar152 * auVar130._8_4_;
            auVar135._12_4_ = fVar129 * fStack_a54 + fVar153 * auVar130._12_4_;
            auVar198._0_4_ = fVar154 * (float)local_a40._0_4_ + auVar133._0_4_ * fVar144;
            auVar198._4_4_ = fVar155 * (float)local_a40._4_4_ + auVar133._4_4_ * fVar151;
            auVar198._8_4_ = fVar128 * fStack_a38 + auVar133._8_4_ * fVar152;
            auVar198._12_4_ = fVar129 * fStack_a34 + auVar133._12_4_ * fVar153;
            auVar149._20_4_ = fVar155 * (float)local_ac0._4_4_ + fVar151 * auVar141._4_4_;
            auVar149._16_4_ = fVar154 * (float)local_ac0._0_4_ + fVar144 * auVar141._0_4_;
            auVar149._24_4_ = fVar128 * fStack_ab8 + fVar152 * auVar141._8_4_;
            auVar149._28_4_ = fVar129 * fStack_ab4 + fVar153 * auVar141._12_4_;
            auVar156._20_4_ = fVar155 * (float)local_aa0._4_4_ + auVar131._4_4_ * fVar151;
            auVar156._16_4_ = fVar154 * (float)local_aa0._0_4_ + auVar131._0_4_ * fVar144;
            auVar156._24_4_ = fVar128 * fStack_a98 + auVar131._8_4_ * fVar152;
            auVar156._28_4_ = fVar129 * fStack_a94 + auVar131._12_4_ * fVar153;
            auVar161._20_4_ = fVar155 * (float)local_cb0._4_4_ + auVar140._4_4_ * fVar151;
            auVar161._16_4_ = fVar154 * (float)local_cb0._0_4_ + auVar140._0_4_ * fVar144;
            auVar161._24_4_ = fVar128 * fStack_ca8 + auVar140._8_4_ * fVar152;
            auVar161._28_4_ = fVar129 * fStack_ca4 + auVar140._12_4_ * fVar153;
            auVar200._0_4_ = auVar117._0_4_ * fVar154 + fVar144 * auVar147._0_4_;
            auVar200._4_4_ = auVar117._4_4_ * fVar155 + fVar151 * auVar147._4_4_;
            auVar200._8_4_ = auVar117._8_4_ * fVar128 + fVar152 * auVar147._8_4_;
            auVar200._12_4_ = auVar117._12_4_ * fVar129 + fVar153 * auVar147._12_4_;
            lVar10 = uVar107 + 0x40 + lVar101;
            local_9a0 = *(undefined8 *)(lVar10 + 0x10);
            uStack_998 = *(undefined8 *)(lVar10 + 0x18);
            uStack_990 = local_9a0;
            uStack_988 = uStack_998;
            lVar101 = uVar107 + 0x50 + lVar101;
            local_9c0 = *(undefined8 *)(lVar101 + 0x10);
            uStack_9b8 = *(undefined8 *)(lVar101 + 0x18);
            auVar187._0_4_ = fVar154 * (float)local_ab0._0_4_ + fVar144 * auVar146._0_4_;
            auVar187._4_4_ = fVar155 * (float)local_ab0._4_4_ + fVar151 * auVar146._4_4_;
            auVar187._8_4_ = fVar128 * fStack_aa8 + fVar152 * auVar146._8_4_;
            auVar187._12_4_ = fVar129 * fStack_aa4 + fVar153 * auVar146._12_4_;
            auVar119._0_4_ = fVar154 * (float)local_cc0._0_4_ + fVar144 * auVar143._0_4_;
            auVar119._4_4_ = fVar155 * (float)local_cc0._4_4_ + fVar151 * auVar143._4_4_;
            auVar119._8_4_ = fVar128 * fStack_cb8 + fVar152 * auVar143._8_4_;
            auVar119._12_4_ = fVar129 * fStack_cb4 + fVar153 * auVar143._12_4_;
            uStack_9b0 = local_9c0;
            uStack_9a8 = uStack_9b8;
            auVar124._16_16_ = auVar164;
            auVar124._0_16_ = auVar164;
            auVar137._16_16_ = auVar135;
            auVar137._0_16_ = auVar135;
            auVar165._16_16_ = auVar198;
            auVar165._0_16_ = auVar198;
            auVar174._16_16_ = auVar200;
            auVar174._0_16_ = auVar200;
            auVar183._16_16_ = auVar187;
            auVar183._0_16_ = auVar187;
            auVar121._16_16_ = auVar119;
            auVar121._0_16_ = auVar119;
            local_c20 = vsubps_avx(auVar149,auVar124);
            local_b60 = vsubps_avx(auVar156,auVar137);
            auVar120 = vsubps_avx(auVar161,auVar165);
            auVar136 = vsubps_avx(auVar174,auVar149);
            auVar124 = vsubps_avx(auVar183,auVar156);
            auVar121 = vsubps_avx(auVar121,auVar161);
            fVar153 = auVar121._0_4_;
            fVar186 = local_b60._0_4_;
            fVar15 = auVar121._4_4_;
            fVar190 = local_b60._4_4_;
            auVar75._4_4_ = fVar190 * fVar15;
            auVar75._0_4_ = fVar186 * fVar153;
            fVar25 = auVar121._8_4_;
            fVar191 = local_b60._8_4_;
            auVar75._8_4_ = fVar191 * fVar25;
            fVar35 = auVar121._12_4_;
            fVar192 = local_b60._12_4_;
            auVar75._12_4_ = fVar192 * fVar35;
            fVar45 = auVar121._16_4_;
            fVar193 = local_b60._16_4_;
            auVar75._16_4_ = fVar193 * fVar45;
            fVar55 = auVar121._20_4_;
            fVar194 = local_b60._20_4_;
            auVar75._20_4_ = fVar194 * fVar55;
            fVar65 = auVar121._24_4_;
            fVar195 = local_b60._24_4_;
            auVar75._24_4_ = fVar195 * fVar65;
            auVar75._28_4_ = auVar119._12_4_;
            fVar154 = auVar124._0_4_;
            fVar163 = auVar120._0_4_;
            fVar16 = auVar124._4_4_;
            fVar168 = auVar120._4_4_;
            auVar76._4_4_ = fVar168 * fVar16;
            auVar76._0_4_ = fVar163 * fVar154;
            fVar26 = auVar124._8_4_;
            fVar169 = auVar120._8_4_;
            auVar76._8_4_ = fVar169 * fVar26;
            fVar36 = auVar124._12_4_;
            fVar170 = auVar120._12_4_;
            auVar76._12_4_ = fVar170 * fVar36;
            fVar46 = auVar124._16_4_;
            fVar171 = auVar120._16_4_;
            auVar76._16_4_ = fVar171 * fVar46;
            fVar56 = auVar124._20_4_;
            fVar172 = auVar120._20_4_;
            auVar76._20_4_ = fVar172 * fVar56;
            fVar66 = auVar124._24_4_;
            fVar173 = auVar120._24_4_;
            auVar76._24_4_ = fVar173 * fVar66;
            auVar76._28_4_ = auVar164._12_4_;
            local_b80 = vsubps_avx(auVar76,auVar75);
            fVar155 = auVar136._0_4_;
            fVar17 = auVar136._4_4_;
            auVar77._4_4_ = fVar168 * fVar17;
            auVar77._0_4_ = fVar163 * fVar155;
            fVar27 = auVar136._8_4_;
            auVar77._8_4_ = fVar169 * fVar27;
            fVar37 = auVar136._12_4_;
            auVar77._12_4_ = fVar170 * fVar37;
            fVar47 = auVar136._16_4_;
            auVar77._16_4_ = fVar171 * fVar47;
            fVar57 = auVar136._20_4_;
            auVar77._20_4_ = fVar172 * fVar57;
            fVar67 = auVar136._24_4_;
            auVar77._24_4_ = fVar173 * fVar67;
            auVar77._28_4_ = auVar164._12_4_;
            fVar128 = local_c20._0_4_;
            fVar18 = local_c20._4_4_;
            auVar78._4_4_ = fVar15 * fVar18;
            auVar78._0_4_ = fVar153 * fVar128;
            fVar28 = local_c20._8_4_;
            auVar78._8_4_ = fVar25 * fVar28;
            fVar38 = local_c20._12_4_;
            auVar78._12_4_ = fVar35 * fVar38;
            fVar48 = local_c20._16_4_;
            auVar78._16_4_ = fVar45 * fVar48;
            fVar58 = local_c20._20_4_;
            auVar78._20_4_ = fVar55 * fVar58;
            fVar68 = local_c20._24_4_;
            auVar78._24_4_ = fVar65 * fVar68;
            auVar78._28_4_ = auVar135._12_4_;
            auVar120 = vsubps_avx(auVar78,auVar77);
            auVar79._4_4_ = fVar16 * fVar18;
            auVar79._0_4_ = fVar154 * fVar128;
            auVar79._8_4_ = fVar26 * fVar28;
            auVar79._12_4_ = fVar36 * fVar38;
            auVar79._16_4_ = fVar46 * fVar48;
            auVar79._20_4_ = fVar56 * fVar58;
            auVar79._24_4_ = fVar66 * fVar68;
            auVar79._28_4_ = auVar135._12_4_;
            auVar80._4_4_ = fVar190 * fVar17;
            auVar80._0_4_ = fVar186 * fVar155;
            auVar80._8_4_ = fVar191 * fVar27;
            auVar80._12_4_ = fVar192 * fVar37;
            auVar80._16_4_ = fVar193 * fVar47;
            auVar80._20_4_ = fVar194 * fVar57;
            auVar80._24_4_ = fVar195 * fVar67;
            auVar80._28_4_ = local_b60._28_4_;
            local_c40 = vsubps_avx(auVar80,auVar79);
            uVar3 = *(undefined4 *)&(ray->org).field_0;
            auVar188._4_4_ = uVar3;
            auVar188._0_4_ = uVar3;
            auVar188._8_4_ = uVar3;
            auVar188._12_4_ = uVar3;
            auVar188._16_4_ = uVar3;
            auVar188._20_4_ = uVar3;
            auVar188._24_4_ = uVar3;
            auVar188._28_4_ = uVar3;
            uVar3 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
            auVar196._4_4_ = uVar3;
            auVar196._0_4_ = uVar3;
            auVar196._8_4_ = uVar3;
            auVar196._12_4_ = uVar3;
            auVar196._16_4_ = uVar3;
            auVar196._20_4_ = uVar3;
            auVar196._24_4_ = uVar3;
            auVar196._28_4_ = uVar3;
            uVar4 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
            auVar199._4_4_ = uVar4;
            auVar199._0_4_ = uVar4;
            auVar199._8_4_ = uVar4;
            auVar199._12_4_ = uVar4;
            auVar199._16_4_ = uVar4;
            auVar199._20_4_ = uVar4;
            auVar199._24_4_ = uVar4;
            auVar199._28_4_ = uVar4;
            fVar144 = (ray->dir).field_0.m128[1];
            local_ba0 = vsubps_avx(auVar149,auVar188);
            fVar151 = (ray->dir).field_0.m128[2];
            auVar75 = vsubps_avx(auVar156,auVar196);
            auVar76 = vsubps_avx(auVar161,auVar199);
            fVar129 = auVar76._0_4_;
            fVar19 = auVar76._4_4_;
            auVar81._4_4_ = fVar144 * fVar19;
            auVar81._0_4_ = fVar144 * fVar129;
            fVar29 = auVar76._8_4_;
            auVar81._8_4_ = fVar144 * fVar29;
            fVar39 = auVar76._12_4_;
            auVar81._12_4_ = fVar144 * fVar39;
            fVar49 = auVar76._16_4_;
            auVar81._16_4_ = fVar144 * fVar49;
            fVar59 = auVar76._20_4_;
            auVar81._20_4_ = fVar144 * fVar59;
            fVar69 = auVar76._24_4_;
            auVar81._24_4_ = fVar144 * fVar69;
            auVar81._28_4_ = uVar3;
            fVar150 = auVar75._0_4_;
            fVar20 = auVar75._4_4_;
            auVar82._4_4_ = fVar151 * fVar20;
            auVar82._0_4_ = fVar151 * fVar150;
            fVar30 = auVar75._8_4_;
            auVar82._8_4_ = fVar151 * fVar30;
            fVar40 = auVar75._12_4_;
            auVar82._12_4_ = fVar151 * fVar40;
            fVar50 = auVar75._16_4_;
            auVar82._16_4_ = fVar151 * fVar50;
            fVar60 = auVar75._20_4_;
            auVar82._20_4_ = fVar151 * fVar60;
            fVar70 = auVar75._24_4_;
            auVar82._24_4_ = fVar151 * fVar70;
            auVar82._28_4_ = uVar4;
            auVar75 = vsubps_avx(auVar82,auVar81);
            fVar152 = (ray->dir).field_0.m128[0];
            fVar11 = local_ba0._0_4_;
            fVar21 = local_ba0._4_4_;
            auVar83._4_4_ = fVar151 * fVar21;
            auVar83._0_4_ = fVar151 * fVar11;
            fVar31 = local_ba0._8_4_;
            auVar83._8_4_ = fVar151 * fVar31;
            fVar41 = local_ba0._12_4_;
            auVar83._12_4_ = fVar151 * fVar41;
            fVar51 = local_ba0._16_4_;
            auVar83._16_4_ = fVar151 * fVar51;
            fVar61 = local_ba0._20_4_;
            auVar83._20_4_ = fVar151 * fVar61;
            fVar71 = local_ba0._24_4_;
            auVar83._24_4_ = fVar151 * fVar71;
            auVar83._28_4_ = local_b80._28_4_;
            auVar84._4_4_ = fVar152 * fVar19;
            auVar84._0_4_ = fVar152 * fVar129;
            auVar84._8_4_ = fVar152 * fVar29;
            auVar84._12_4_ = fVar152 * fVar39;
            auVar84._16_4_ = fVar152 * fVar49;
            auVar84._20_4_ = fVar152 * fVar59;
            auVar84._24_4_ = fVar152 * fVar69;
            auVar84._28_4_ = auVar164._12_4_;
            auVar76 = vsubps_avx(auVar84,auVar83);
            auVar85._4_4_ = fVar152 * fVar20;
            auVar85._0_4_ = fVar152 * fVar150;
            auVar85._8_4_ = fVar152 * fVar30;
            auVar85._12_4_ = fVar152 * fVar40;
            auVar85._16_4_ = fVar152 * fVar50;
            auVar85._20_4_ = fVar152 * fVar60;
            auVar85._24_4_ = fVar152 * fVar70;
            auVar85._28_4_ = auVar164._12_4_;
            auVar86._4_4_ = fVar144 * fVar21;
            auVar86._0_4_ = fVar144 * fVar11;
            auVar86._8_4_ = fVar144 * fVar31;
            auVar86._12_4_ = fVar144 * fVar41;
            auVar86._16_4_ = fVar144 * fVar51;
            auVar86._20_4_ = fVar144 * fVar61;
            auVar86._24_4_ = fVar144 * fVar71;
            auVar86._28_4_ = local_ba0._28_4_;
            auVar77 = vsubps_avx(auVar86,auVar85);
            fVar12 = local_c40._0_4_;
            fVar22 = local_c40._4_4_;
            fVar32 = local_c40._8_4_;
            fVar42 = local_c40._12_4_;
            fVar52 = local_c40._16_4_;
            fVar62 = local_c40._20_4_;
            fVar72 = local_c40._24_4_;
            fVar13 = auVar120._0_4_;
            fVar23 = auVar120._4_4_;
            fVar33 = auVar120._8_4_;
            fVar43 = auVar120._12_4_;
            fVar53 = auVar120._16_4_;
            fVar63 = auVar120._20_4_;
            fVar73 = auVar120._24_4_;
            fVar14 = local_b80._0_4_;
            fVar24 = local_b80._4_4_;
            fVar34 = local_b80._8_4_;
            fVar44 = local_b80._12_4_;
            fVar54 = local_b80._16_4_;
            fVar64 = local_b80._20_4_;
            fVar74 = local_b80._24_4_;
            auVar138._0_4_ = fVar152 * fVar14 + fVar144 * fVar13 + fVar151 * fVar12;
            auVar138._4_4_ = fVar152 * fVar24 + fVar144 * fVar23 + fVar151 * fVar22;
            auVar138._8_4_ = fVar152 * fVar34 + fVar144 * fVar33 + fVar151 * fVar32;
            auVar138._12_4_ = fVar152 * fVar44 + fVar144 * fVar43 + fVar151 * fVar42;
            auVar138._16_4_ = fVar152 * fVar54 + fVar144 * fVar53 + fVar151 * fVar52;
            auVar138._20_4_ = fVar152 * fVar64 + fVar144 * fVar63 + fVar151 * fVar62;
            auVar138._24_4_ = fVar152 * fVar74 + fVar144 * fVar73 + fVar151 * fVar72;
            auVar138._28_4_ = fVar151 + fVar151 + local_ba0._28_4_;
            auVar125._8_4_ = 0x80000000;
            auVar125._0_8_ = 0x8000000080000000;
            auVar125._12_4_ = 0x80000000;
            auVar125._16_4_ = 0x80000000;
            auVar125._20_4_ = 0x80000000;
            auVar125._24_4_ = 0x80000000;
            auVar125._28_4_ = 0x80000000;
            auVar120 = vandps_avx(auVar138,auVar125);
            uVar102 = auVar120._0_4_;
            auVar159._0_4_ =
                 (float)(uVar102 ^
                        (uint)(fVar155 * auVar75._0_4_ +
                              fVar154 * auVar76._0_4_ + fVar153 * auVar77._0_4_));
            uVar176 = auVar120._4_4_;
            auVar159._4_4_ =
                 (float)(uVar176 ^
                        (uint)(fVar17 * auVar75._4_4_ +
                              fVar16 * auVar76._4_4_ + fVar15 * auVar77._4_4_));
            uVar177 = auVar120._8_4_;
            auVar159._8_4_ =
                 (float)(uVar177 ^
                        (uint)(fVar27 * auVar75._8_4_ +
                              fVar26 * auVar76._8_4_ + fVar25 * auVar77._8_4_));
            uVar178 = auVar120._12_4_;
            auVar159._12_4_ =
                 (float)(uVar178 ^
                        (uint)(fVar37 * auVar75._12_4_ +
                              fVar36 * auVar76._12_4_ + fVar35 * auVar77._12_4_));
            uVar179 = auVar120._16_4_;
            auVar159._16_4_ =
                 (float)(uVar179 ^
                        (uint)(fVar47 * auVar75._16_4_ +
                              fVar46 * auVar76._16_4_ + fVar45 * auVar77._16_4_));
            uVar180 = auVar120._20_4_;
            auVar159._20_4_ =
                 (float)(uVar180 ^
                        (uint)(fVar57 * auVar75._20_4_ +
                              fVar56 * auVar76._20_4_ + fVar55 * auVar77._20_4_));
            uVar181 = auVar120._24_4_;
            auVar159._24_4_ =
                 (float)(uVar181 ^
                        (uint)(fVar67 * auVar75._24_4_ +
                              fVar66 * auVar76._24_4_ + fVar65 * auVar77._24_4_));
            uVar182 = auVar120._28_4_;
            auVar159._28_4_ =
                 (float)(uVar182 ^ (uint)(auVar136._28_4_ + auVar124._28_4_ + auVar121._28_4_));
            auVar166._0_4_ =
                 (float)(uVar102 ^
                        (uint)(auVar75._0_4_ * fVar128 +
                              auVar76._0_4_ * fVar186 + fVar163 * auVar77._0_4_));
            auVar166._4_4_ =
                 (float)(uVar176 ^
                        (uint)(auVar75._4_4_ * fVar18 +
                              auVar76._4_4_ * fVar190 + fVar168 * auVar77._4_4_));
            auVar166._8_4_ =
                 (float)(uVar177 ^
                        (uint)(auVar75._8_4_ * fVar28 +
                              auVar76._8_4_ * fVar191 + fVar169 * auVar77._8_4_));
            auVar166._12_4_ =
                 (float)(uVar178 ^
                        (uint)(auVar75._12_4_ * fVar38 +
                              auVar76._12_4_ * fVar192 + fVar170 * auVar77._12_4_));
            auVar166._16_4_ =
                 (float)(uVar179 ^
                        (uint)(auVar75._16_4_ * fVar48 +
                              auVar76._16_4_ * fVar193 + fVar171 * auVar77._16_4_));
            auVar166._20_4_ =
                 (float)(uVar180 ^
                        (uint)(auVar75._20_4_ * fVar58 +
                              auVar76._20_4_ * fVar194 + fVar172 * auVar77._20_4_));
            auVar166._24_4_ =
                 (float)(uVar181 ^
                        (uint)(auVar75._24_4_ * fVar68 +
                              auVar76._24_4_ * fVar195 + fVar173 * auVar77._24_4_));
            auVar166._28_4_ = (float)(uVar182 ^ (uint)(auVar76._28_4_ + auVar77._28_4_ + -0.0));
            auVar136 = ZEXT1232(ZEXT412(0)) << 0x20;
            auVar120 = vcmpps_avx(auVar159,auVar136,5);
            auVar136 = vcmpps_avx(auVar166,auVar136,5);
            auVar120 = vandps_avx(auVar120,auVar136);
            auVar126._8_4_ = 0x7fffffff;
            auVar126._0_8_ = 0x7fffffff7fffffff;
            auVar126._12_4_ = 0x7fffffff;
            auVar126._16_4_ = 0x7fffffff;
            auVar126._20_4_ = 0x7fffffff;
            auVar126._24_4_ = 0x7fffffff;
            auVar126._28_4_ = 0x7fffffff;
            local_920 = vandps_avx(auVar138,auVar126);
            auVar136 = vcmpps_avx(ZEXT1232(ZEXT412(0)) << 0x20,auVar138,4);
            auVar120 = vandps_avx(auVar120,auVar136);
            auVar127._0_4_ = auVar166._0_4_ + auVar159._0_4_;
            auVar127._4_4_ = auVar166._4_4_ + auVar159._4_4_;
            auVar127._8_4_ = auVar166._8_4_ + auVar159._8_4_;
            auVar127._12_4_ = auVar166._12_4_ + auVar159._12_4_;
            auVar127._16_4_ = auVar166._16_4_ + auVar159._16_4_;
            auVar127._20_4_ = auVar166._20_4_ + auVar159._20_4_;
            auVar127._24_4_ = auVar166._24_4_ + auVar159._24_4_;
            auVar127._28_4_ = auVar166._28_4_ + auVar159._28_4_;
            auVar124 = vcmpps_avx(auVar127,local_920,2);
            auVar136 = vandps_avx(auVar120,auVar124);
            auVar121 = local_a20 & auVar136;
            if ((((((((auVar121 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar121 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar121 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar121 >> 0x7f,0) != '\0') ||
                  (auVar121 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar121 >> 0xbf,0) != '\0') ||
                (auVar121 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar121[0x1f] < '\0') {
              auVar136 = vandps_avx(auVar136,local_a20);
              local_940._0_4_ =
                   (float)(uVar102 ^ (uint)(fVar14 * fVar11 + fVar13 * fVar150 + fVar129 * fVar12));
              local_940._4_4_ =
                   (float)(uVar176 ^ (uint)(fVar24 * fVar21 + fVar23 * fVar20 + fVar19 * fVar22));
              local_940._8_4_ =
                   (float)(uVar177 ^ (uint)(fVar34 * fVar31 + fVar33 * fVar30 + fVar29 * fVar32));
              local_940._12_4_ =
                   (float)(uVar178 ^ (uint)(fVar44 * fVar41 + fVar43 * fVar40 + fVar39 * fVar42));
              local_940._16_4_ =
                   (float)(uVar179 ^ (uint)(fVar54 * fVar51 + fVar53 * fVar50 + fVar49 * fVar52));
              local_940._20_4_ =
                   (float)(uVar180 ^ (uint)(fVar64 * fVar61 + fVar63 * fVar60 + fVar59 * fVar62));
              local_940._24_4_ =
                   (float)(uVar181 ^ (uint)(fVar74 * fVar71 + fVar73 * fVar70 + fVar69 * fVar72));
              local_940._28_4_ =
                   uVar182 ^ (uint)(auVar124._28_4_ + auVar124._28_4_ + auVar120._28_4_);
              fVar144 = (ray->org).field_0.m128[3];
              fVar151 = local_920._0_4_;
              fVar152 = local_920._4_4_;
              auVar87._4_4_ = fVar152 * fVar144;
              auVar87._0_4_ = fVar151 * fVar144;
              fVar153 = local_920._8_4_;
              auVar87._8_4_ = fVar153 * fVar144;
              fVar154 = local_920._12_4_;
              auVar87._12_4_ = fVar154 * fVar144;
              fVar155 = local_920._16_4_;
              auVar87._16_4_ = fVar155 * fVar144;
              fVar128 = local_920._20_4_;
              auVar87._20_4_ = fVar128 * fVar144;
              fVar129 = local_920._24_4_;
              auVar87._24_4_ = fVar129 * fVar144;
              auVar87._28_4_ = fVar144;
              auVar120 = vcmpps_avx(auVar87,local_940,1);
              fVar144 = ray->tfar;
              auVar88._4_4_ = fVar152 * fVar144;
              auVar88._0_4_ = fVar151 * fVar144;
              auVar88._8_4_ = fVar153 * fVar144;
              auVar88._12_4_ = fVar154 * fVar144;
              auVar88._16_4_ = fVar155 * fVar144;
              auVar88._20_4_ = fVar128 * fVar144;
              auVar88._24_4_ = fVar129 * fVar144;
              auVar88._28_4_ = fVar144;
              auVar124 = vcmpps_avx(local_940,auVar88,2);
              auVar120 = vandps_avx(auVar124,auVar120);
              auVar124 = auVar136 & auVar120;
              if ((((((((auVar124 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar124 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar124 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar124 >> 0x7f,0) != '\0') ||
                    (auVar124 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar124 >> 0xbf,0) != '\0') ||
                  (auVar124 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar124[0x1f] < '\0') {
                local_8e0 = vandps_avx(auVar136,auVar120);
                auVar120 = vsubps_avx(local_920,auVar166);
                local_980 = vblendvps_avx(auVar159,auVar120,local_9e0);
                auVar120 = vsubps_avx(local_920,auVar159);
                local_960 = vblendvps_avx(auVar166,auVar120,local_9e0);
                uStack_844 = local_9e0._28_4_;
                local_860[0] = fVar14 * (float)local_a00._0_4_;
                local_860[1] = fVar24 * (float)local_a00._4_4_;
                local_860[2] = fVar34 * fStack_9f8;
                local_860[3] = fVar44 * fStack_9f4;
                fStack_850 = fVar54 * fStack_9f0;
                fStack_84c = fVar64 * fStack_9ec;
                fStack_848 = fVar74 * fStack_9e8;
                local_840[0] = fVar13 * (float)local_a00._0_4_;
                local_840[1] = fVar23 * (float)local_a00._4_4_;
                local_840[2] = fVar33 * fStack_9f8;
                local_840[3] = fVar43 * fStack_9f4;
                fStack_830 = fVar53 * fStack_9f0;
                fStack_82c = fVar63 * fStack_9ec;
                fStack_828 = fVar73 * fStack_9e8;
                uStack_824 = uStack_844;
                auVar120 = vrcpps_avx(local_920);
                local_820[0] = (float)local_a00._0_4_ * fVar12;
                local_820[1] = (float)local_a00._4_4_ * fVar22;
                local_820[2] = fStack_9f8 * fVar32;
                local_820[3] = fStack_9f4 * fVar42;
                fStack_810 = fStack_9f0 * fVar52;
                fStack_80c = fStack_9ec * fVar62;
                fStack_808 = fStack_9e8 * fVar72;
                uStack_804 = uStack_844;
                fVar144 = auVar120._0_4_;
                fVar150 = auVar120._4_4_;
                auVar89._4_4_ = fVar152 * fVar150;
                auVar89._0_4_ = fVar151 * fVar144;
                fVar151 = auVar120._8_4_;
                auVar89._8_4_ = fVar153 * fVar151;
                fVar152 = auVar120._12_4_;
                auVar89._12_4_ = fVar154 * fVar152;
                fVar153 = auVar120._16_4_;
                auVar89._16_4_ = fVar155 * fVar153;
                fVar154 = auVar120._20_4_;
                auVar89._20_4_ = fVar128 * fVar154;
                fVar155 = auVar120._24_4_;
                auVar89._24_4_ = fVar129 * fVar155;
                auVar89._28_4_ = local_920._28_4_;
                auVar157._8_4_ = 0x3f800000;
                auVar157._0_8_ = 0x3f8000003f800000;
                auVar157._12_4_ = 0x3f800000;
                auVar157._16_4_ = 0x3f800000;
                auVar157._20_4_ = 0x3f800000;
                auVar157._24_4_ = 0x3f800000;
                auVar157._28_4_ = 0x3f800000;
                auVar120 = vsubps_avx(auVar157,auVar89);
                fVar144 = fVar144 + fVar144 * auVar120._0_4_;
                fVar150 = fVar150 + fVar150 * auVar120._4_4_;
                fVar151 = fVar151 + fVar151 * auVar120._8_4_;
                fVar152 = fVar152 + fVar152 * auVar120._12_4_;
                fVar153 = fVar153 + fVar153 * auVar120._16_4_;
                fVar154 = fVar154 + fVar154 * auVar120._20_4_;
                fVar155 = fVar155 + fVar155 * auVar120._24_4_;
                local_880._4_4_ = fVar150 * local_940._4_4_;
                local_880._0_4_ = fVar144 * local_940._0_4_;
                local_880._8_4_ = fVar151 * local_940._8_4_;
                local_880._12_4_ = fVar152 * local_940._12_4_;
                local_880._16_4_ = fVar153 * local_940._16_4_;
                local_880._20_4_ = fVar154 * local_940._20_4_;
                local_880._24_4_ = fVar155 * local_940._24_4_;
                local_880._28_4_ = local_940._28_4_;
                local_8c0[0] = local_980._0_4_ * fVar144;
                local_8c0[1] = local_980._4_4_ * fVar150;
                local_8c0[2] = local_980._8_4_ * fVar151;
                local_8c0[3] = local_980._12_4_ * fVar152;
                fStack_8b0 = local_980._16_4_ * fVar153;
                fStack_8ac = local_980._20_4_ * fVar154;
                fStack_8a8 = local_980._24_4_ * fVar155;
                uStack_8a4 = local_980._28_4_;
                local_8a0._4_4_ = local_960._4_4_ * fVar150;
                local_8a0._0_4_ = local_960._0_4_ * fVar144;
                local_8a0._8_4_ = local_960._8_4_ * fVar151;
                local_8a0._12_4_ = local_960._12_4_ * fVar152;
                local_8a0._16_4_ = local_960._16_4_ * fVar153;
                local_8a0._20_4_ = local_960._20_4_ * fVar154;
                local_8a0._24_4_ = local_960._24_4_ * fVar155;
                local_8a0._28_4_ = local_980._28_4_;
                uVar102 = vmovmskps_avx(local_8e0);
                uVar106 = (ulong)uVar102;
                _local_cc0 = auVar148;
                _local_cb0 = auVar90;
                _local_ac0 = auVar91;
                _local_ab0 = auVar92;
                _local_aa0 = auVar93;
                _local_a90 = auVar94;
                _local_a80 = auVar95;
                _local_a70 = auVar96;
                _local_a60 = auVar97;
                _local_a50 = auVar98;
                _local_a40 = auVar99;
                do {
                  uVar108 = 0;
                  if (uVar106 != 0) {
                    for (; (uVar106 >> uVar108 & 1) == 0; uVar108 = uVar108 + 1) {
                    }
                  }
                  local_be8 = *(uint *)((long)&local_9a0 + uVar108 * 4);
                  pGVar7 = (local_cd0->geometries).items[local_be8].ptr;
                  if ((pGVar7->mask & ray->mask) == 0) {
                    uVar106 = uVar106 ^ 1L << (uVar108 & 0x3f);
                  }
                  else {
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar7->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_002c6b14:
                      ray->tfar = -INFINITY;
                      return;
                    }
                    local_c20._0_8_ = context->args;
                    local_b60._0_8_ = uVar106;
                    local_bd0.context = context->user;
                    local_c00 = local_860[uVar108];
                    local_bfc = local_840[uVar108];
                    local_bf8 = local_820[uVar108];
                    local_bf4 = local_8c0[uVar108];
                    local_bf0 = *(undefined4 *)(local_8a0 + uVar108 * 4);
                    local_bec = *(undefined4 *)((long)&local_9c0 + uVar108 * 4);
                    local_be4 = (local_bd0.context)->instID[0];
                    local_be0 = (local_bd0.context)->instPrimID[0];
                    local_c40._0_4_ = ray->tfar;
                    local_b80._0_8_ = uVar108;
                    ray->tfar = local_860[uVar108 - 8];
                    local_cd4 = -1;
                    local_bd0.valid = &local_cd4;
                    local_bd0.geometryUserPtr = pGVar7->userPtr;
                    local_bd0.hit = (RTCHitN *)&local_c00;
                    local_bd0.N = 1;
                    local_ba0._0_8_ = pGVar7;
                    local_bd0.ray = (RTCRayN *)ray;
                    if ((pGVar7->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                       ((*pGVar7->occlusionFilterN)(&local_bd0), *local_bd0.valid != 0)) {
                      if ((*(code **)(local_c20._0_8_ + 0x10) == (code *)0x0) ||
                         ((((*(byte *)local_c20._0_8_ & 2) == 0 &&
                           ((*(byte *)(local_ba0._0_8_ + 0x3e) & 0x40) == 0)) ||
                          ((**(code **)(local_c20._0_8_ + 0x10))(&local_bd0), *local_bd0.valid != 0)
                          ))) goto LAB_002c6b14;
                    }
                    ray->tfar = (float)local_c40._0_4_;
                    uVar106 = local_b60._0_8_ ^ 1L << (local_b80._0_8_ & 0x3f);
                  }
                } while (uVar106 != 0);
              }
            }
            local_cc8 = local_cc8 + 1;
            auVar158 = ZEXT1664(ZEXT816(0) << 0x40);
          } while (local_cc8 != local_c88);
        }
        auVar160 = ZEXT1664(local_ad0);
        auVar162 = ZEXT1664(local_ae0);
        auVar167 = ZEXT1664(local_af0);
        auVar175 = ZEXT1664(local_b00);
        auVar184 = ZEXT1664(local_b10);
        auVar185 = ZEXT1664(local_b20);
        auVar189 = ZEXT1664(local_b30);
        auVar197 = ZEXT1664(local_b40);
        uVar106 = local_c98;
        uVar108 = local_ca0;
      } while (local_c90 != &local_800);
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }